

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int VP8LEncodeImage(WebPConfig *config,WebPPicture *picture)

{
  int iVar1;
  WebPAuxStats *pWVar2;
  int iVar3;
  uint32_t bits;
  int iVar4;
  WebPEncodingError error;
  uint8_t *puVar5;
  uint8_t *puVar6;
  long lVar7;
  WebPAuxStats *stats;
  ulong uVar8;
  int percent;
  int local_88;
  int local_84;
  uint8_t *local_80;
  uint local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 uStack_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  VP8LBitWriter bw;
  
  percent = 0;
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  if ((config == (WebPConfig *)0x0) || (picture->argb == (uint32_t *)0x0)) {
    error = VP8_ENC_ERROR_NULL_PARAMETER;
    goto LAB_00134cab;
  }
  iVar4 = picture->width;
  iVar1 = picture->height;
  iVar3 = VP8LBitWriterInit(&bw,(long)(iVar1 * iVar4 << (config->image_hint != WEBP_HINT_GRAPH)));
  error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  if (iVar3 != 0) {
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
    iVar3 = WebPReportProgress(picture,1,&percent);
    if (iVar3 == 0) {
      error = VP8_ENC_ERROR_USER_ABORT;
    }
    else {
      pWVar2 = picture->stats;
      local_88 = iVar1;
      local_84 = iVar4;
      if (pWVar2 != (WebPAuxStats *)0x0) {
        memset(pWVar2,0,0xbc);
        pWVar2->PSNR[0] = 99.0;
        pWVar2->PSNR[1] = 99.0;
        pWVar2->PSNR[2] = 99.0;
        pWVar2->PSNR[3] = 99.0;
        pWVar2->PSNR[4] = 99.0;
      }
      iVar4 = picture->height;
      VP8LPutBits(&bw,picture->width - 1,0xe);
      VP8LPutBits(&bw,iVar4 - 1,0xe);
      if (bw.error_ == 0) {
        bits = WebPPictureHasTransparency(picture);
        error = VP8_ENC_ERROR_OUT_OF_MEMORY;
        VP8LPutBits(&bw,bits,1);
        VP8LPutBits(&bw,0,3);
        if (bw.error_ == 0) {
          iVar4 = WebPReportProgress(picture,5,&percent);
          if (iVar4 == 0) {
LAB_00134cc3:
            error = VP8_ENC_ERROR_USER_ABORT;
          }
          else {
            error = VP8LEncodeStream(config,picture,&bw,1);
            if (error == VP8_ENC_OK) {
              iVar4 = WebPReportProgress(picture,0x5a,&percent);
              if (iVar4 == 0) goto LAB_00134cc3;
              puVar5 = VP8LBitWriterFinish(&bw);
              lVar7 = (long)(bw.used_ + 7 >> 3);
              puVar6 = bw.cur_ + (lVar7 - (long)bw.buf_) + 1;
              uVar8 = (ulong)((uint)puVar6 & 1);
              local_80 = bw.cur_ + (lVar7 - (long)bw.buf_) + uVar8 + 0xd;
              local_78 = 0x46464952;
              uStack_70 = 0x50424557;
              uStack_6c = 0x4c385056;
              uStack_64 = 0x2f;
              uStack_74 = SUB84(local_80,0);
              uStack_68 = SUB81(puVar6,0);
              uStack_67 = (undefined1)((ulong)puVar6 >> 8);
              uStack_66 = (undefined1)((ulong)puVar6 >> 0x10);
              uStack_65 = (undefined1)((ulong)puVar6 >> 0x18);
              iVar4 = (*picture->writer)((uint8_t *)&local_78,0x15,picture);
              error = VP8_ENC_ERROR_BAD_WRITE;
              if ((iVar4 != 0) &&
                 (iVar3 = (*picture->writer)(puVar5,(size_t)(bw.cur_ + (lVar7 - (long)bw.buf_)),
                                             picture), iVar1 = local_84, iVar4 = local_88,
                 iVar3 != 0)) {
                if (uVar8 != 0) {
                  local_78 = local_78 & 0xffffff00;
                  iVar3 = (*picture->writer)((uint8_t *)&local_78,1,picture);
                  if (iVar3 == 0) goto LAB_00134c8e;
                }
                iVar3 = WebPReportProgress(picture,100,&percent);
                error = VP8_ENC_ERROR_USER_ABORT;
                if (iVar3 != 0) {
                  pWVar2 = picture->stats;
                  if (pWVar2 != (WebPAuxStats *)0x0) {
                    iVar3 = (int)local_80 + 8;
                    pWVar2->coded_size = pWVar2->coded_size + iVar3;
                    pWVar2->lossless_size = iVar3;
                  }
                  if (picture->extra_info == (uint8_t *)0x0) {
                    error = VP8_ENC_OK;
                  }
                  else {
                    error = VP8_ENC_OK;
                    memset(picture->extra_info,0,(long)((iVar4 + 0xf >> 4) * (iVar1 + 0xf >> 4)));
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00134c8e:
  if (bw.error_ != 0) {
    error = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  VP8LBitWriterWipeOut(&bw);
  if (error == VP8_ENC_OK) {
    return 1;
  }
LAB_00134cab:
  WebPEncodingSetError(picture,error);
  return 0;
}

Assistant:

int VP8LEncodeImage(const WebPConfig* const config,
                    const WebPPicture* const picture) {
  int width, height;
  int has_alpha;
  size_t coded_size;
  int percent = 0;
  int initial_size;
  WebPEncodingError err = VP8_ENC_OK;
  VP8LBitWriter bw;

  if (picture == NULL) return 0;

  if (config == NULL || picture->argb == NULL) {
    err = VP8_ENC_ERROR_NULL_PARAMETER;
    WebPEncodingSetError(picture, err);
    return 0;
  }

  width = picture->width;
  height = picture->height;
  // Initialize BitWriter with size corresponding to 16 bpp to photo images and
  // 8 bpp for graphical images.
  initial_size = (config->image_hint == WEBP_HINT_GRAPH) ?
      width * height : width * height * 2;
  if (!VP8LBitWriterInit(&bw, initial_size)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  if (!WebPReportProgress(picture, 1, &percent)) {
 UserAbort:
    err = VP8_ENC_ERROR_USER_ABORT;
    goto Error;
  }
  // Reset stats (for pure lossless coding)
  if (picture->stats != NULL) {
    WebPAuxStats* const stats = picture->stats;
    memset(stats, 0, sizeof(*stats));
    stats->PSNR[0] = 99.f;
    stats->PSNR[1] = 99.f;
    stats->PSNR[2] = 99.f;
    stats->PSNR[3] = 99.f;
    stats->PSNR[4] = 99.f;
  }

  // Write image size.
  if (!WriteImageSize(picture, &bw)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  has_alpha = WebPPictureHasTransparency(picture);
  // Write the non-trivial Alpha flag and lossless version.
  if (!WriteRealAlphaAndVersion(&bw, has_alpha)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  if (!WebPReportProgress(picture, 5, &percent)) goto UserAbort;

  // Encode main image stream.
  err = VP8LEncodeStream(config, picture, &bw, 1 /*use_cache*/);
  if (err != VP8_ENC_OK) goto Error;

  if (!WebPReportProgress(picture, 90, &percent)) goto UserAbort;

  // Finish the RIFF chunk.
  err = WriteImage(picture, &bw, &coded_size);
  if (err != VP8_ENC_OK) goto Error;

  if (!WebPReportProgress(picture, 100, &percent)) goto UserAbort;

#if !defined(WEBP_DISABLE_STATS)
  // Save size.
  if (picture->stats != NULL) {
    picture->stats->coded_size += (int)coded_size;
    picture->stats->lossless_size = (int)coded_size;
  }
#endif

  if (picture->extra_info != NULL) {
    const int mb_w = (width + 15) >> 4;
    const int mb_h = (height + 15) >> 4;
    memset(picture->extra_info, 0, mb_w * mb_h * sizeof(*picture->extra_info));
  }

 Error:
  if (bw.error_) err = VP8_ENC_ERROR_OUT_OF_MEMORY;
  VP8LBitWriterWipeOut(&bw);
  if (err != VP8_ENC_OK) {
    WebPEncodingSetError(picture, err);
    return 0;
  }
  return 1;
}